

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O0

string * __thiscall RegressionTree::genVarianceComputation_abi_cxx11_(RegressionTree *this)

{
  Query *pQVar1;
  bool bVar2;
  ostream *poVar3;
  reference pvVar4;
  reference this_00;
  size_type sVar5;
  reference ppAVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  reference ppQVar7;
  reference pvVar8;
  reference pvVar9;
  value_type *pvVar10;
  ulong uVar11;
  long in_RSI;
  string *in_RDI;
  string thresholdStruct;
  string functionIndex;
  string computeVariance;
  size_t j;
  size_t *comp_quad;
  size_t *comp_linear;
  size_t *comp_count_1;
  size_t *comp_viewID_1;
  Query *complement_1;
  string viewString;
  size_t viewID_3;
  size_t varianceCount;
  string categFunctionIndex;
  string contFunctionIndex;
  string categVariance;
  string contVariance;
  string initVariance;
  size_t *viewID_2;
  size_t var;
  size_t numOfContThresholds;
  string numOfThresholds;
  string viewTup_1;
  size_t *compquad;
  size_t *complinear;
  size_t *compcount;
  size_t *quad_1;
  size_t *linear_1;
  size_t *count_1;
  size_t *cviewID3;
  size_t *cviewID2;
  size_t *cviewID;
  size_t *viewID3_1;
  size_t *viewID2_1;
  size_t *viewID_1;
  Query *query_1;
  Attribute *att;
  string viewTup;
  size_t *comp_count;
  size_t *quad;
  size_t *linear;
  size_t *count;
  size_t *comp_viewID;
  Query *complement;
  size_t *viewID3;
  size_t *viewID2;
  size_t *viewID;
  Query *query;
  QueryThresholdPair *qtPair;
  iterator __end1;
  iterator __begin1;
  vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_> *__range1;
  vector<Query_*,_std::allocator<Query_*>_> complementQueryPerView;
  vector<unsigned_long,_std::allocator<unsigned_long>_> firstThreshold;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  functionPerView;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  variancePerView;
  value_type *in_stack_ffffffffffffcf08;
  QueryCompiler *in_stack_ffffffffffffcf10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffcf18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  TreeDecomposition *in_stack_ffffffffffffcf20;
  size_type in_stack_ffffffffffffcf28;
  allocator *paVar12;
  vector<Query_*,_std::allocator<Query_*>_> *in_stack_ffffffffffffcf30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffcf38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffcf40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Application *in_stack_ffffffffffffcf48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffcf50;
  value_type vVar13;
  undefined6 in_stack_ffffffffffffcf58;
  undefined1 in_stack_ffffffffffffcf5e;
  undefined1 in_stack_ffffffffffffcf5f;
  string local_2ff0 [32];
  string local_2fd0 [32];
  string local_2fb0 [32];
  string local_2f90 [32];
  string local_2f70 [32];
  string local_2f50 [32];
  string local_2f30 [32];
  string local_2f10 [32];
  string local_2ef0 [32];
  string local_2ed0 [32];
  string local_2eb0 [32];
  string local_2e90 [32];
  string local_2e70 [32];
  string local_2e50 [32];
  string local_2e30 [32];
  string local_2e10 [32];
  string local_2df0 [32];
  string local_2dd0 [32];
  string local_2db0 [32];
  string local_2d90 [32];
  string local_2d70 [32];
  string local_2d50 [32];
  string local_2d30 [32];
  string local_2d10 [32];
  string local_2cf0 [32];
  string local_2cd0 [32];
  string local_2cb0 [32];
  string local_2c90 [32];
  string local_2c70 [32];
  string local_2c50 [32];
  string local_2c30 [32];
  string local_2c10 [32];
  string local_2bf0 [32];
  string local_2bd0 [32];
  string local_2bb0 [32];
  string local_2b90 [32];
  string local_2b70 [32];
  string local_2b50 [32];
  string local_2b30 [32];
  string local_2b10 [32];
  string local_2af0 [32];
  string local_2ad0 [32];
  string local_2ab0 [32];
  string local_2a90 [32];
  string local_2a70 [32];
  string local_2a50 [32];
  string local_2a30 [32];
  string local_2a10 [32];
  string local_29f0 [32];
  string local_29d0 [32];
  string local_29b0 [32];
  string local_2990 [32];
  string local_2970 [32];
  string local_2950 [32];
  string local_2930 [32];
  string local_2910 [32];
  string local_28f0 [32];
  string local_28d0 [32];
  string local_28b0 [32];
  string local_2890 [32];
  string local_2870 [32];
  string local_2850 [32];
  string local_2830 [32];
  string local_2810 [32];
  string local_27f0 [32];
  string local_27d0 [32];
  string local_27b0 [32];
  string local_2790 [32];
  string local_2770 [32];
  string local_2750 [32];
  string local_2730 [32];
  string local_2710 [32];
  string local_26f0 [32];
  string local_26d0 [32];
  string local_26b0 [32];
  string local_2690 [32];
  string local_2670 [32];
  string local_2650 [32];
  string local_2630 [32];
  string local_2610 [32];
  string local_25f0 [32];
  string local_25d0 [32];
  string local_25b0 [32];
  string local_2590 [32];
  string local_2570 [32];
  string local_2550 [32];
  string local_2530 [32];
  string local_2510 [32];
  string local_24f0 [32];
  string local_24d0 [32];
  string local_24b0 [32];
  string local_2490 [32];
  string local_2470 [32];
  string local_2450 [32];
  string local_2430 [32];
  string local_2410 [32];
  string local_23f0 [32];
  string local_23d0 [32];
  string local_23b0 [32];
  string local_2390 [32];
  string local_2370 [32];
  string local_2350 [32];
  string local_2330 [32];
  string local_2310 [32];
  string local_22f0 [32];
  string local_22d0 [32];
  string local_22b0 [32];
  string local_2290 [32];
  string local_2270 [32];
  string local_2250 [32];
  string local_2230 [32];
  string local_2210 [32];
  string local_21f0 [32];
  string local_21d0 [32];
  string local_21b0 [32];
  string local_2190 [32];
  string local_2170 [32];
  string local_2150 [32];
  string local_2130 [32];
  string local_2110 [32];
  string local_20f0 [32];
  string local_20d0 [32];
  string local_20b0 [32];
  string local_2090 [32];
  string local_2070 [32];
  string local_2050 [32];
  string local_2030 [32];
  string local_2010 [32];
  string local_1ff0 [32];
  string local_1fd0 [32];
  string local_1fb0 [32];
  string local_1f90 [32];
  string local_1f70 [32];
  string local_1f50 [32];
  string local_1f30 [32];
  string local_1f10 [32];
  string local_1ef0 [32];
  string local_1ed0 [32];
  string local_1eb0 [32];
  string local_1e90 [32];
  string local_1e70 [32];
  string local_1e50 [32];
  string local_1e30 [32];
  string local_1e10 [32];
  string local_1df0 [32];
  string local_1dd0 [32];
  string local_1db0 [32];
  string local_1d90 [32];
  string local_1d70 [32];
  string local_1d50 [32];
  string local_1d30 [32];
  string local_1d10 [32];
  string local_1cf0 [32];
  string local_1cd0 [32];
  string local_1cb0 [32];
  string local_1c90 [32];
  string local_1c70 [32];
  string local_1c50 [32];
  string local_1c30 [32];
  string local_1c10 [32];
  string local_1bf0 [32];
  string local_1bd0 [32];
  string local_1bb0 [32];
  value_type *local_1b90;
  string local_1b88 [32];
  string local_1b68 [32];
  string local_1b48 [32];
  string local_1b28 [32];
  string local_1b08 [32];
  string local_1ae8 [32];
  string local_1ac8 [32];
  string local_1aa8 [32];
  string local_1a88 [32];
  string local_1a68 [32];
  string local_1a48 [32];
  string local_1a28 [32];
  string local_1a08 [32];
  string local_19e8 [32];
  string local_19c8 [32];
  string local_19a8 [32];
  string local_1988 [32];
  string local_1968 [32];
  string local_1948 [32];
  string local_1928 [32];
  string local_1908 [32];
  string local_18e8 [32];
  string local_18c8 [32];
  string local_18a8 [32];
  string local_1888 [32];
  string local_1868 [32];
  string local_1848 [32];
  string local_1828 [32];
  string local_1808 [32];
  string local_17e8 [32];
  string local_17c8 [32];
  string local_17a8 [32];
  string local_1788 [32];
  string local_1768 [32];
  string local_1748 [32];
  string local_1728 [32];
  string local_1708 [32];
  string local_16e8 [32];
  string local_16c8 [32];
  string local_16a8 [32];
  string local_1688 [32];
  string local_1668 [32];
  string local_1648 [32];
  string local_1628 [32];
  string local_1608 [32];
  string local_15e8 [32];
  string local_15c8 [32];
  string local_15a8 [32];
  string local_1588 [32];
  string local_1568 [32];
  string local_1548 [32];
  string local_1528 [32];
  string local_1508 [32];
  string local_14e8 [32];
  string local_14c8 [32];
  string local_14a8 [32];
  string local_1488 [32];
  string local_1468 [32];
  string local_1448 [32];
  string local_1428 [32];
  string local_1408 [32];
  string local_13e8 [32];
  string local_13c8 [32];
  string local_13a8 [32];
  string local_1388 [32];
  string local_1368 [32];
  string local_1348 [32];
  string local_1328 [32];
  string local_1308 [32];
  string local_12e8 [32];
  string local_12c8 [32];
  string local_12a8 [32];
  string local_1288 [32];
  unsigned_long *local_1268;
  unsigned_long *local_1260;
  unsigned_long *local_1258;
  reference local_1250;
  value_type local_1248;
  string local_1240 [32];
  string local_1220 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1200;
  long local_11f8;
  allocator local_11e9;
  string local_11e8 [39];
  allocator local_11c1;
  string local_11c0 [39];
  allocator local_1199;
  string local_1198 [39];
  undefined1 local_1171 [33];
  string local_1150 [32];
  string local_1130 [32];
  string local_1110 [32];
  string local_10f0 [32];
  string local_10d0 [32];
  string local_10b0 [32];
  string local_1090 [32];
  string local_1070 [32];
  string local_1050 [32];
  string local_1030 [32];
  reference local_1010;
  ulong local_1008;
  value_type local_1000;
  allocator local_ff1;
  string local_ff0 [32];
  string local_fd0 [32];
  string local_fb0 [32];
  string local_f90 [32];
  string local_f70 [32];
  string local_f50 [32];
  string local_f30 [32];
  string local_f10 [32];
  string local_ef0 [32];
  string local_ed0 [32];
  string local_eb0 [32];
  string local_e90 [32];
  string local_e70 [32];
  string local_e50 [32];
  string local_e30 [32];
  string local_e10 [32];
  string local_df0 [32];
  string local_dd0 [32];
  string local_db0 [32];
  string local_d90 [32];
  string local_d70 [32];
  string local_d50 [32];
  string local_d30 [32];
  string local_d10 [32];
  string local_cf0 [32];
  string local_cd0 [32];
  string local_cb0 [32];
  string local_c90 [32];
  string local_c70 [32];
  string local_c50 [32];
  string local_c30 [32];
  string local_c10 [32];
  string local_bf0 [32];
  string local_bd0 [32];
  string local_bb0 [32];
  string local_b90 [32];
  string local_b70 [32];
  string local_b50 [32];
  string local_b30 [32];
  string local_b10 [32];
  string local_af0 [32];
  string local_ad0 [32];
  string local_ab0 [32];
  string local_a90 [32];
  string local_a70 [32];
  string local_a50 [32];
  string local_a30 [32];
  string local_a10 [32];
  string local_9f0 [32];
  string local_9d0 [32];
  string local_9b0 [32];
  string local_990 [32];
  string local_970 [32];
  string local_950 [32];
  string local_930 [32];
  string local_910 [32];
  string local_8f0 [32];
  string local_8d0 [32];
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  unsigned_long *local_690;
  unsigned_long *local_688;
  unsigned_long *local_680;
  unsigned_long *local_678;
  unsigned_long *local_670;
  unsigned_long *local_668;
  reference local_660;
  reference local_658;
  reference local_650;
  reference local_648;
  reference local_640;
  reference local_638;
  Query *local_630;
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  Attribute *local_408;
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  unsigned_long *local_120;
  unsigned_long *local_118;
  unsigned_long *local_110;
  unsigned_long *local_108;
  reference local_100;
  Query *local_f8;
  reference local_f0;
  reference local_e8;
  reference local_e0;
  Query *local_d8;
  reference local_d0;
  reference local_c0;
  QueryThresholdPair *local_b8;
  __normal_iterator<QueryThresholdPair_*,_std::vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>_>
  local_b0;
  vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_> *local_a8;
  vector<Query_*,_std::allocator<Query_*>_> local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58 [2];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_28;
  
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x22e763);
  QueryCompiler::numberOfViews((QueryCompiler *)0x22e76b);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::allocator((allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x22e788);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)in_stack_ffffffffffffcf30,in_stack_ffffffffffffcf28,
           (allocator_type *)in_stack_ffffffffffffcf20);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~allocator((allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x22e7b4);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x22e7c5);
  QueryCompiler::numberOfViews((QueryCompiler *)0x22e7cd);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::allocator((allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x22e7ec);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)in_stack_ffffffffffffcf30,in_stack_ffffffffffffcf28,
           (allocator_type *)in_stack_ffffffffffffcf20);
  std::
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~allocator((allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x22e818);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x22e82d);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffcf30,
             in_stack_ffffffffffffcf28,(allocator_type *)in_stack_ffffffffffffcf20);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x22e856);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x22e867);
  QueryCompiler::numberOfViews((QueryCompiler *)0x22e86f);
  std::allocator<Query_*>::allocator((allocator<Query_*> *)0x22e88e);
  std::vector<Query_*,_std::allocator<Query_*>_>::vector
            (in_stack_ffffffffffffcf30,in_stack_ffffffffffffcf28,
             (allocator_type *)in_stack_ffffffffffffcf20);
  std::allocator<Query_*>::~allocator((allocator<Query_*> *)0x22e8ba);
  local_a8 = &queryToThreshold;
  local_b0._M_current =
       (QueryThresholdPair *)
       std::vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>::begin
                 ((vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_> *)
                  in_stack_ffffffffffffcf08);
  local_b8 = (QueryThresholdPair *)
             std::vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>::end
                       ((vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_> *)
                        in_stack_ffffffffffffcf08);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<QueryThresholdPair_*,_std::vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>_>
                             *)in_stack_ffffffffffffcf10,
                            (__normal_iterator<QueryThresholdPair_*,_std::vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>_>
                             *)in_stack_ffffffffffffcf08), bVar2) {
    local_c0 = __gnu_cxx::
               __normal_iterator<QueryThresholdPair_*,_std::vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>_>
               ::operator*(&local_b0);
    std::bitset<100UL>::operator[]
              ((bitset<100UL> *)in_stack_ffffffffffffcf18,(size_t)in_stack_ffffffffffffcf10);
    bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffcf10);
    std::bitset<100UL>::reference::~reference(&local_d0);
    if (bVar2) {
      local_d8 = local_c0->query;
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_d8->_aggregates,0);
      local_e0 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[](&(*ppAVar6)->_incoming,0);
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_d8->_aggregates,1);
      local_e8 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[](&(*ppAVar6)->_incoming,0);
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_d8->_aggregates,2);
      local_f0 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[](&(*ppAVar6)->_incoming,0);
      local_f8 = local_c0->complementQuery;
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_f8->_aggregates,0);
      local_100 = std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::operator[](&(*ppAVar6)->_incoming,0);
      if ((local_e0->first != local_e8->first) || (local_e0->first != local_f0->first)) {
        poVar3 = std::operator<<((ostream *)&std::cout,"THERE IS AN ERROR IN genVarianceComputation"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_d8->_aggregates,0);
      pvVar8 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar6)->_incoming,0);
      local_108 = &pvVar8->second;
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_d8->_aggregates,1);
      pvVar8 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar6)->_incoming,0);
      local_110 = &pvVar8->second;
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_d8->_aggregates,2);
      pvVar8 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar6)->_incoming,0);
      local_118 = &pvVar8->second;
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_f8->_aggregates,0);
      pvVar8 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar6)->_incoming,0);
      local_120 = &pvVar8->second;
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((char *)in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::~string(local_180);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[](&local_28,local_e0->first);
      std::operator+(in_stack_ffffffffffffcf38,(char *)in_stack_ffffffffffffcf30);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffcf10,in_stack_ffffffffffffcf08);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_400);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_3e0);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::string::~string(local_300);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string(local_340);
      std::__cxx11::string::~string(local_360);
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::string::~string(local_380);
      pQVar1 = local_f8;
      ppQVar7 = std::vector<Query_*,_std::allocator<Query_*>_>::operator[]
                          (&local_98,local_e0->first);
      *ppQVar7 = pQVar1;
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x22f0ce);
      local_408 = TreeDecomposition::getAttribute
                            (in_stack_ffffffffffffcf20,(size_t)in_stack_ffffffffffffcf18);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[](local_58,local_e0->first);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((char *)in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffcf10,in_stack_ffffffffffffcf08);
      std::__cxx11::string::~string(local_428);
      std::__cxx11::string::~string(local_448);
      std::__cxx11::string::~string(local_468);
      std::__cxx11::string::~string(local_628);
      std::__cxx11::string::~string(local_488);
      std::__cxx11::string::~string(local_4a8);
      std::__cxx11::string::~string(local_608);
      std::__cxx11::string::~string(local_4c8);
      std::__cxx11::string::~string(local_4e8);
      std::__cxx11::string::~string(local_508);
      std::__cxx11::string::~string(local_5e8);
      std::__cxx11::string::~string(local_528);
      std::__cxx11::string::~string(local_548);
      std::__cxx11::string::~string(local_568);
      std::__cxx11::string::~string(local_588);
      std::__cxx11::string::~string(local_5a8);
      std::__cxx11::string::~string(local_5c8);
      std::__cxx11::string::~string(local_140);
    }
    else {
      local_630 = local_c0->query;
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_630->_aggregates,0);
      local_638 = std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::operator[](&(*ppAVar6)->_incoming,0);
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_630->_aggregates,1);
      local_640 = std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::operator[](&(*ppAVar6)->_incoming,0);
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_630->_aggregates,2);
      local_648 = std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::operator[](&(*ppAVar6)->_incoming,0);
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_630->_aggregates,3);
      local_650 = std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::operator[](&(*ppAVar6)->_incoming,0);
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_630->_aggregates,4);
      local_658 = std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::operator[](&(*ppAVar6)->_incoming,0);
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_630->_aggregates,5);
      local_660 = std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::operator[](&(*ppAVar6)->_incoming,0);
      if (((local_638->first != local_640->first) || (local_638->first != local_648->first)) ||
         ((local_650->first != local_638->first ||
          ((local_658->first != local_638->first || (local_660->first != local_638->first)))))) {
        poVar3 = std::operator<<((ostream *)&std::cout,"THERE IS AN ERROR IN genVarianceComputation"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_630->_aggregates,0);
      pvVar8 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar6)->_incoming,0);
      local_668 = &pvVar8->second;
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_630->_aggregates,1);
      pvVar8 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar6)->_incoming,0);
      local_670 = &pvVar8->second;
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_630->_aggregates,2);
      pvVar8 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar6)->_incoming,0);
      local_678 = &pvVar8->second;
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_630->_aggregates,3);
      pvVar8 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar6)->_incoming,0);
      local_680 = &pvVar8->second;
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_630->_aggregates,4);
      pvVar8 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar6)->_incoming,0);
      local_688 = &pvVar8->second;
      ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_630->_aggregates,5);
      pvVar8 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar6)->_incoming,0);
      local_690 = &pvVar8->second;
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((char *)in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::string::~string(local_6d0);
      std::__cxx11::string::~string(local_6f0);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[](&local_28,local_638->first);
      std::operator+((char *)CONCAT17(in_stack_ffffffffffffcf5f,
                                      CONCAT16(in_stack_ffffffffffffcf5e,in_stack_ffffffffffffcf58))
                     ,in_stack_ffffffffffffcf50);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffcf10,in_stack_ffffffffffffcf08);
      std::__cxx11::string::~string(local_710);
      std::__cxx11::string::~string(local_730);
      std::__cxx11::string::~string(local_d30);
      std::__cxx11::string::~string(local_750);
      std::__cxx11::string::~string(local_770);
      std::__cxx11::string::~string(local_790);
      std::__cxx11::string::~string(local_7b0);
      std::__cxx11::string::~string(local_d10);
      std::__cxx11::string::~string(local_7d0);
      std::__cxx11::string::~string(local_7f0);
      std::__cxx11::string::~string(local_810);
      std::__cxx11::string::~string(local_830);
      std::__cxx11::string::~string(local_cf0);
      std::__cxx11::string::~string(local_850);
      std::__cxx11::string::~string(local_870);
      std::__cxx11::string::~string(local_890);
      std::__cxx11::string::~string(local_8b0);
      std::__cxx11::string::~string(local_cd0);
      std::__cxx11::string::~string(local_8d0);
      std::__cxx11::string::~string(local_8f0);
      std::__cxx11::string::~string(local_910);
      std::__cxx11::string::~string(local_930);
      std::__cxx11::string::~string(local_cb0);
      std::__cxx11::string::~string(local_950);
      std::__cxx11::string::~string(local_970);
      std::__cxx11::string::~string(local_990);
      std::__cxx11::string::~string(local_9b0);
      std::__cxx11::string::~string(local_c90);
      std::__cxx11::string::~string(local_9d0);
      std::__cxx11::string::~string(local_9f0);
      std::__cxx11::string::~string(local_a10);
      std::__cxx11::string::~string(local_a30);
      std::__cxx11::string::~string(local_c70);
      std::__cxx11::string::~string(local_a50);
      std::__cxx11::string::~string(local_a70);
      std::__cxx11::string::~string(local_a90);
      std::__cxx11::string::~string(local_ab0);
      std::__cxx11::string::~string(local_c50);
      std::__cxx11::string::~string(local_ad0);
      std::__cxx11::string::~string(local_af0);
      std::__cxx11::string::~string(local_b10);
      std::__cxx11::string::~string(local_b30);
      std::__cxx11::string::~string(local_c30);
      std::__cxx11::string::~string(local_b50);
      std::__cxx11::string::~string(local_b70);
      std::__cxx11::string::~string(local_b90);
      std::__cxx11::string::~string(local_bb0);
      std::__cxx11::string::~string(local_c10);
      std::__cxx11::string::~string(local_bd0);
      std::__cxx11::string::~string(local_bf0);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[](local_58,local_638->first);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((char *)in_stack_ffffffffffffcf18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((double)in_stack_ffffffffffffcf18);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffcf10,in_stack_ffffffffffffcf08);
      std::__cxx11::string::~string(local_d50);
      std::__cxx11::string::~string(local_d70);
      std::__cxx11::string::~string(local_d90);
      std::__cxx11::string::~string(local_fd0);
      std::__cxx11::string::~string(local_db0);
      std::__cxx11::string::~string(local_dd0);
      std::__cxx11::string::~string(local_fb0);
      std::__cxx11::string::~string(local_df0);
      std::__cxx11::string::~string(local_e10);
      std::__cxx11::string::~string(local_e30);
      std::__cxx11::string::~string(local_f90);
      std::__cxx11::string::~string(local_e50);
      std::__cxx11::string::~string(local_e70);
      std::__cxx11::string::~string(local_f70);
      std::__cxx11::string::~string(local_e90);
      std::__cxx11::string::~string(local_eb0);
      std::__cxx11::string::~string(local_ed0);
      std::__cxx11::string::~string(local_f50);
      std::__cxx11::string::~string(local_ef0);
      std::__cxx11::string::~string(local_f10);
      std::__cxx11::string::~string(local_f30);
      std::__cxx11::string::~string(local_6b0);
    }
    __gnu_cxx::
    __normal_iterator<QueryThresholdPair_*,_std::vector<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>_>
    ::operator++(&local_b0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ff0,"numberOfThresholds = ",&local_ff1);
  std::allocator<char>::~allocator((allocator<char> *)&local_ff1);
  local_1000 = 0;
  for (local_1008 = 0; local_1008 < 100; local_1008 = local_1008 + 1) {
    bVar2 = std::bitset<100UL>::test
                      ((bitset<100UL> *)in_stack_ffffffffffffcf10,(size_t)in_stack_ffffffffffffcf08)
    ;
    if (bVar2) {
      bVar2 = std::bitset<100UL>::test
                        ((bitset<100UL> *)in_stack_ffffffffffffcf10,
                         (size_t)in_stack_ffffffffffffcf08);
      if (bVar2) {
        in_stack_ffffffffffffcf48 = (Application *)0x0;
        ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                            ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                             (*(long *)(*(long *)(in_RSI + 0xd8) + local_1008 * 8) + 0x18),0);
        local_1010 = std::
                     vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ::operator[](&(*ppAVar6)->_incoming,(size_type)in_stack_ffffffffffffcf48);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
        std::operator+((char *)in_stack_ffffffffffffcf18,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf10);
        std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
        std::__cxx11::string::operator+=(local_ff0,local_1030);
        std::__cxx11::string::~string(local_1030);
        std::__cxx11::string::~string(local_1050);
        std::__cxx11::string::~string(local_1070);
      }
      else {
        vVar13 = local_1000;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_78,local_1008);
        *pvVar4 = vVar13;
        this_00 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)(in_RSI + 0xe0),local_1008);
        sVar5 = std::vector<double,_std::allocator<double>_>::size(this_00);
        local_1000 = sVar5 + local_1000;
      }
    }
  }
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
  std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
  std::__cxx11::string::operator+=(local_ff0,local_1090);
  std::__cxx11::string::~string(local_1090);
  std::__cxx11::string::~string(local_10b0);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)in_stack_ffffffffffffcf40);
  std::operator+(in_stack_ffffffffffffcf18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffcf10);
  Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)in_stack_ffffffffffffcf40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40);
  std::operator+(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
  std::__cxx11::string::~string(local_10f0);
  std::__cxx11::string::~string(local_1150);
  std::__cxx11::string::~string(local_1110);
  std::__cxx11::string::~string(local_1130);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1171 + 1),"",(allocator *)__rhs);
  std::allocator<char>::~allocator((allocator<char> *)local_1171);
  paVar12 = &local_1199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1198,"",paVar12);
  std::allocator<char>::~allocator((allocator<char> *)&local_1199);
  paVar12 = &local_11c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11c0,"",paVar12);
  std::allocator<char>::~allocator((allocator<char> *)&local_11c1);
  paVar12 = &local_11e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11e8,"",paVar12);
  std::allocator<char>::~allocator((allocator<char> *)&local_11e9);
  local_11f8 = 0;
  local_1200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    __lhs = local_1200;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2319b4);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              QueryCompiler::numberOfViews((QueryCompiler *)0x2319bc);
    if (this_01 <= __lhs) {
      std::__cxx11::string::string(local_1d30,(string *)(local_1171 + 1));
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffcf10);
        std::__cxx11::string::operator+=(local_1d30,local_1d50);
        std::__cxx11::string::~string(local_1d50);
        std::__cxx11::string::~string(local_1d70);
        std::__cxx11::string::~string(local_1d90);
        std::__cxx11::string::~string(local_1e50);
        std::__cxx11::string::~string(local_1db0);
        std::__cxx11::string::~string(local_1dd0);
        std::__cxx11::string::~string(local_1e30);
        std::__cxx11::string::~string(local_1df0);
        std::__cxx11::string::~string(local_1e10);
      }
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::string::operator+=(local_1d30,local_1e70);
      std::__cxx11::string::~string(local_1e70);
      std::__cxx11::string::~string(local_1e90);
      std::__cxx11::string::~string(local_24b0);
      std::__cxx11::string::~string(local_1eb0);
      std::__cxx11::string::~string(local_1ed0);
      std::__cxx11::string::~string(local_1ef0);
      std::__cxx11::string::~string(local_1f10);
      std::__cxx11::string::~string(local_1f30);
      std::__cxx11::string::~string(local_1f50);
      std::__cxx11::string::~string(local_1f70);
      std::__cxx11::string::~string(local_1f90);
      std::__cxx11::string::~string(local_1fb0);
      std::__cxx11::string::~string(local_2490);
      std::__cxx11::string::~string(local_1fd0);
      std::__cxx11::string::~string(local_1ff0);
      std::__cxx11::string::~string(local_2470);
      std::__cxx11::string::~string(local_2010);
      std::__cxx11::string::~string(local_2030);
      std::__cxx11::string::~string(local_2050);
      std::__cxx11::string::~string(local_2070);
      std::__cxx11::string::~string(local_2450);
      std::__cxx11::string::~string(local_2090);
      std::__cxx11::string::~string(local_20b0);
      std::__cxx11::string::~string(local_2430);
      std::__cxx11::string::~string(local_20d0);
      std::__cxx11::string::~string(local_20f0);
      std::__cxx11::string::~string(local_2410);
      std::__cxx11::string::~string(local_2110);
      std::__cxx11::string::~string(local_2130);
      std::__cxx11::string::~string(local_23f0);
      std::__cxx11::string::~string(local_2150);
      std::__cxx11::string::~string(local_2170);
      std::__cxx11::string::~string(local_23d0);
      std::__cxx11::string::~string(local_2190);
      std::__cxx11::string::~string(local_21b0);
      std::__cxx11::string::~string(local_23b0);
      std::__cxx11::string::~string(local_21d0);
      std::__cxx11::string::~string(local_21f0);
      std::__cxx11::string::~string(local_2390);
      std::__cxx11::string::~string(local_2210);
      std::__cxx11::string::~string(local_2230);
      std::__cxx11::string::~string(local_2370);
      std::__cxx11::string::~string(local_2250);
      std::__cxx11::string::~string(local_2270);
      std::__cxx11::string::~string(local_2350);
      std::__cxx11::string::~string(local_2290);
      std::__cxx11::string::~string(local_22b0);
      std::__cxx11::string::~string(local_2330);
      std::__cxx11::string::~string(local_22d0);
      std::__cxx11::string::~string(local_22f0);
      std::__cxx11::string::~string(local_2310);
      std::__cxx11::string::string(local_24d0,local_11c0);
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffcf10);
        std::__cxx11::string::operator+=(local_24d0,local_24f0);
        std::__cxx11::string::~string(local_24f0);
        std::__cxx11::string::~string(local_2510);
        std::__cxx11::string::~string(local_2530);
        std::__cxx11::string::~string(local_2590);
        std::__cxx11::string::~string(local_2550);
        std::__cxx11::string::~string(local_2570);
      }
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::string::~string(local_25d0);
      std::__cxx11::string::~string(local_2bf0);
      std::__cxx11::string::~string(local_25f0);
      std::__cxx11::string::~string(local_2610);
      std::__cxx11::string::~string(local_2bd0);
      std::__cxx11::string::~string(local_2630);
      std::__cxx11::string::~string(local_2650);
      std::__cxx11::string::~string(local_2bb0);
      std::__cxx11::string::~string(local_2670);
      std::__cxx11::string::~string(local_2690);
      std::__cxx11::string::~string(local_2b90);
      std::__cxx11::string::~string(local_26b0);
      std::__cxx11::string::~string(local_26d0);
      std::__cxx11::string::~string(local_2b70);
      std::__cxx11::string::~string(local_26f0);
      std::__cxx11::string::~string(local_2710);
      std::__cxx11::string::~string(local_2b50);
      std::__cxx11::string::~string(local_2730);
      std::__cxx11::string::~string(local_2750);
      std::__cxx11::string::~string(local_2b30);
      std::__cxx11::string::~string(local_2770);
      std::__cxx11::string::~string(local_2790);
      std::__cxx11::string::~string(local_2b10);
      std::__cxx11::string::~string(local_27b0);
      std::__cxx11::string::~string(local_27d0);
      std::__cxx11::string::~string(local_2af0);
      std::__cxx11::string::~string(local_27f0);
      std::__cxx11::string::~string(local_2810);
      std::__cxx11::string::~string(local_2830);
      std::__cxx11::string::~string(local_2ad0);
      std::__cxx11::string::~string(local_2850);
      std::__cxx11::string::~string(local_2870);
      std::__cxx11::string::~string(local_2ab0);
      std::__cxx11::string::~string(local_2890);
      std::__cxx11::string::~string(local_28b0);
      std::__cxx11::string::~string(local_2a90);
      std::__cxx11::string::~string(local_28d0);
      std::__cxx11::string::~string(local_28f0);
      std::__cxx11::string::~string(local_2a70);
      std::__cxx11::string::~string(local_2910);
      std::__cxx11::string::~string(local_2930);
      std::__cxx11::string::~string(local_2a50);
      std::__cxx11::string::~string(local_2950);
      std::__cxx11::string::~string(local_2970);
      std::__cxx11::string::~string(local_2a30);
      std::__cxx11::string::~string(local_2990);
      std::__cxx11::string::~string(local_29b0);
      std::__cxx11::string::~string(local_2a10);
      std::__cxx11::string::~string(local_29d0);
      std::__cxx11::string::~string(local_29f0);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffcf10);
      Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf48,__rhs);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
      std::__cxx11::string::~string(local_2c10);
      std::__cxx11::string::~string(local_2ff0);
      std::__cxx11::string::~string(local_2c30);
      std::__cxx11::string::~string(local_2c50);
      std::__cxx11::string::~string(local_2c70);
      std::__cxx11::string::~string(local_2fd0);
      std::__cxx11::string::~string(local_2c90);
      std::__cxx11::string::~string(local_2cb0);
      std::__cxx11::string::~string(local_2fb0);
      std::__cxx11::string::~string(local_2cd0);
      std::__cxx11::string::~string(local_2cf0);
      std::__cxx11::string::~string(local_2f90);
      std::__cxx11::string::~string(local_2d10);
      std::__cxx11::string::~string(local_2d30);
      std::__cxx11::string::~string(local_2d50);
      std::__cxx11::string::~string(local_2f70);
      std::__cxx11::string::~string(local_2d70);
      std::__cxx11::string::~string(local_2d90);
      std::__cxx11::string::~string(local_2db0);
      std::__cxx11::string::~string(local_2f50);
      std::__cxx11::string::~string(local_2dd0);
      std::__cxx11::string::~string(local_2df0);
      std::__cxx11::string::~string(local_2f30);
      std::__cxx11::string::~string(local_2e10);
      std::__cxx11::string::~string(local_2e30);
      std::__cxx11::string::~string(local_2f10);
      std::__cxx11::string::~string(local_2e50);
      std::__cxx11::string::~string(local_2e70);
      std::__cxx11::string::~string(local_2ef0);
      std::__cxx11::string::~string(local_2e90);
      std::__cxx11::string::~string(local_2eb0);
      std::__cxx11::string::~string(local_2ed0);
      std::__cxx11::string::~string(local_25b0);
      std::__cxx11::string::~string(local_24d0);
      std::__cxx11::string::~string(local_1d30);
      std::__cxx11::string::~string(local_11e8);
      std::__cxx11::string::~string(local_11c0);
      std::__cxx11::string::~string(local_1198);
      std::__cxx11::string::~string((string *)(local_1171 + 1));
      std::__cxx11::string::~string(local_10d0);
      std::__cxx11::string::~string(local_ff0);
      std::vector<Query_*,_std::allocator<Query_*>_>::~vector
                ((vector<Query_*,_std::allocator<Query_*>_> *)this_01);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)this_01);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)this_01);
      return in_RDI;
    }
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[](&local_28,(size_type)local_1200);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_01);
    if (!bVar2) {
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffcf10);
      std::__cxx11::string::~string(local_1240);
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x231a4e);
      in_stack_ffffffffffffcf10 =
           (QueryCompiler *)
           QueryCompiler::getView(in_stack_ffffffffffffcf10,(size_t)in_stack_ffffffffffffcf08);
      bVar2 = std::bitset<100UL>::any((bitset<100UL> *)0x231a73);
      if (bVar2) {
        pvVar9 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_28,(size_type)local_1200);
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(pvVar9);
        if (1 < sVar5) {
          std::operator<<((ostream *)&std::cerr,"THIS IS ODD, EXCEPCTED SIZE IS 1;\n");
          exit(1);
        }
        ppQVar7 = std::vector<Query_*,_std::allocator<Query_*>_>::operator[]
                            (&local_98,(size_type)local_1200);
        local_1248 = *ppQVar7;
        ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                            (&local_1248->_aggregates,0);
        local_1250 = std::
                     vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ::operator[](&(*ppAVar6)->_incoming,0);
        ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                            (&local_1248->_aggregates,0);
        pvVar8 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[](&(*ppAVar6)->_incoming,0);
        local_1258 = &pvVar8->second;
        ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                            (&local_1248->_aggregates,1);
        pvVar8 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[](&(*ppAVar6)->_incoming,0);
        local_1260 = &pvVar8->second;
        ppAVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                            (&local_1248->_aggregates,2);
        pvVar8 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[](&(*ppAVar6)->_incoming,0);
        local_1268 = &pvVar8->second;
        if (((*local_1258 != *local_1260 - 1) || (*local_1258 != *local_1268 - 2)) ||
           (*local_1260 != *local_1268 - 1)) {
          std::operator<<((ostream *)&std::cerr,
                          "We should have expected the aggregates to be contiguous!\n");
          exit(1);
        }
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        pvVar9 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_28,(size_type)local_1200);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](pvVar9,0);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffcf10);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::__cxx11::string::operator+=(local_1198,local_1288);
        std::__cxx11::string::~string(local_1288);
        std::__cxx11::string::~string(local_12a8);
        std::__cxx11::string::~string(local_1928);
        std::__cxx11::string::~string(local_12c8);
        std::__cxx11::string::~string(local_12e8);
        std::__cxx11::string::~string(local_1308);
        std::__cxx11::string::~string(local_1908);
        std::__cxx11::string::~string(local_1328);
        std::__cxx11::string::~string(local_1348);
        std::__cxx11::string::~string(local_1368);
        std::__cxx11::string::~string(local_1388);
        std::__cxx11::string::~string(local_18e8);
        std::__cxx11::string::~string(local_13a8);
        std::__cxx11::string::~string(local_13c8);
        std::__cxx11::string::~string(local_18c8);
        std::__cxx11::string::~string(local_13e8);
        std::__cxx11::string::~string(local_1408);
        std::__cxx11::string::~string(local_18a8);
        std::__cxx11::string::~string(local_1428);
        std::__cxx11::string::~string(local_1448);
        std::__cxx11::string::~string(local_1888);
        std::__cxx11::string::~string(local_1468);
        std::__cxx11::string::~string(local_1488);
        std::__cxx11::string::~string(local_1868);
        std::__cxx11::string::~string(local_14a8);
        std::__cxx11::string::~string(local_14c8);
        std::__cxx11::string::~string(local_1848);
        std::__cxx11::string::~string(local_14e8);
        std::__cxx11::string::~string(local_1508);
        std::__cxx11::string::~string(local_1528);
        std::__cxx11::string::~string(local_1548);
        std::__cxx11::string::~string(local_1568);
        std::__cxx11::string::~string(local_1588);
        std::__cxx11::string::~string(local_1828);
        std::__cxx11::string::~string(local_15a8);
        std::__cxx11::string::~string(local_15c8);
        std::__cxx11::string::~string(local_1808);
        std::__cxx11::string::~string(local_15e8);
        std::__cxx11::string::~string(local_1608);
        std::__cxx11::string::~string(local_1628);
        std::__cxx11::string::~string(local_1648);
        std::__cxx11::string::~string(local_1668);
        std::__cxx11::string::~string(local_1688);
        std::__cxx11::string::~string(local_16a8);
        std::__cxx11::string::~string(local_16c8);
        std::__cxx11::string::~string(local_17e8);
        std::__cxx11::string::~string(local_16e8);
        std::__cxx11::string::~string(local_1708);
        std::__cxx11::string::~string(local_17c8);
        std::__cxx11::string::~string(local_1728);
        std::__cxx11::string::~string(local_1748);
        std::__cxx11::string::~string(local_17a8);
        std::__cxx11::string::~string(local_1768);
        std::__cxx11::string::~string(local_1788);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffcf48,__rhs);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        pvVar9 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](local_58,(size_type)local_1200);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](pvVar9,0);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffcf10);
        std::__cxx11::string::operator+=(local_11e8,local_1948);
        std::__cxx11::string::~string(local_1948);
        std::__cxx11::string::~string(local_1968);
        std::__cxx11::string::~string(local_1988);
        std::__cxx11::string::~string(local_1aa8);
        std::__cxx11::string::~string(local_19a8);
        std::__cxx11::string::~string(local_19c8);
        std::__cxx11::string::~string(local_1a88);
        std::__cxx11::string::~string(local_19e8);
        std::__cxx11::string::~string(local_1a08);
        std::__cxx11::string::~string(local_1a68);
        std::__cxx11::string::~string(local_1a28);
        std::__cxx11::string::~string(local_1a48);
      }
      else {
        Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffcf10);
        std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
        std::__cxx11::string::operator+=((string *)(local_1171 + 1),local_1ac8);
        std::__cxx11::string::~string(local_1ac8);
        std::__cxx11::string::~string(local_1ae8);
        std::__cxx11::string::~string(local_1b08);
        std::__cxx11::string::~string(local_1b28);
        std::__cxx11::string::~string(local_1b48);
        std::__cxx11::string::~string(local_1b68);
        std::__cxx11::string::~string(local_1b88);
        local_1b90 = (value_type *)0x0;
        while( true ) {
          in_stack_ffffffffffffcf08 = local_1b90;
          pvVar9 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&local_28,(size_type)local_1200);
          pvVar10 = (value_type *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(pvVar9);
          if (pvVar10 <= in_stack_ffffffffffffcf08) break;
          Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
          std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffcf48,__rhs);
          std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
          pvVar9 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&local_28,(size_type)local_1200);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](pvVar9,(size_type)local_1b90);
          std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffcf10);
          std::__cxx11::string::operator+=((string *)(local_1171 + 1),local_1bb0);
          std::__cxx11::string::~string(local_1bb0);
          std::__cxx11::string::~string(local_1bd0);
          std::__cxx11::string::~string(local_1bf0);
          std::__cxx11::string::~string(local_1c50);
          std::__cxx11::string::~string(local_1c10);
          std::__cxx11::string::~string(local_1c30);
          Application::offset_abi_cxx11_(in_stack_ffffffffffffcf48,(size_t)__rhs);
          std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffcf48);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffcf48,__rhs);
          std::operator+(__lhs,(char *)in_stack_ffffffffffffcf10);
          pvVar9 = std::
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](local_58,(size_type)local_1200);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](pvVar9,(size_type)local_1b90);
          std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffcf10);
          std::__cxx11::string::operator+=(local_11c0,local_1c70);
          std::__cxx11::string::~string(local_1c70);
          std::__cxx11::string::~string(local_1c90);
          std::__cxx11::string::~string(local_1cb0);
          std::__cxx11::string::~string(local_1d10);
          std::__cxx11::string::~string(local_1cd0);
          std::__cxx11::string::~string(local_1cf0);
          local_11f8 = local_11f8 + 1;
          local_1b90 = (value_type *)&local_1b90->field_0x1;
        }
      }
      std::__cxx11::string::~string(local_1220);
    }
    local_1200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_1200->field_0x1;
  } while( true );
}

Assistant:

std::string RegressionTree::genVarianceComputation()
{
    std::vector<std::vector<std::string>> variancePerView(_compiler->numberOfViews());
    //TODO: rename this to thresholdPerView
    std::vector<std::vector<std::string>> functionPerView(_compiler->numberOfViews());
    std::vector<size_t> firstThreshold(NUM_OF_VARIABLES);
    std::vector<Query*> complementQueryPerView(_compiler->numberOfViews());
    
    for (QueryThresholdPair& qtPair : queryToThreshold)
    {
        if (_categoricalFeatures[qtPair.varID])
        {
            // Find the view that corresponds to the query
            Query* query = qtPair.query;
            size_t& viewID = query->_aggregates[0]->_incoming[0].first;
            size_t& viewID2 = query->_aggregates[1]->_incoming[0].first;
            size_t& viewID3 = query->_aggregates[2]->_incoming[0].first;

            Query* complement = qtPair.complementQuery;
            const size_t& comp_viewID = complement->_aggregates[0]->_incoming[0].first;

            if (viewID != viewID2 || viewID != viewID3)
                std::cout << "THERE IS AN ERROR IN genVarianceComputation" << std::endl;
        
            const size_t& count = query->_aggregates[0]->_incoming[0].second;
            const size_t& linear = query->_aggregates[1]->_incoming[0].second;
            const size_t& quad = query->_aggregates[2]->_incoming[0].second;

            const size_t& comp_count = complement->_aggregates[0]->_incoming[0].second;
            // const size_t& comp_linear=complement->_aggregates[1]->_incoming[0].second;
            // const size_t& comp_quad = complement->_aggregates[2]->_incoming[0].second;
        
            std::string viewTup = "V"+std::to_string(viewID)+"tuple";
        
            // variancePerView[viewID].push_back(
            //     "("+viewTup+".aggregates["+std::to_string(count)+"] > 0 ? "+
            //     viewTup+".aggregates["+std::to_string(quad)+"] - ("+
            //     viewTup+".aggregates["+std::to_string(linear)+"] * "+
            //     viewTup+".aggregates["+std::to_string(linear)+"]) / "+
            //     viewTup+".aggregates["+std::to_string(count)+"] : 999);\n"
            //     );
            
            variancePerView[viewID].push_back(
                viewTup+".aggregates["+std::to_string(quad)+"] - ("+
                viewTup+".aggregates["+std::to_string(linear)+"] * "+
                viewTup+".aggregates["+std::to_string(linear)+"]) / "+
                viewTup+".aggregates["+std::to_string(count)+"] + "+
                "difference[2] - (difference[1] * difference[1]) / difference[0];\n"
                );

            complementQueryPerView[viewID] = complement;
            
            Attribute* att = _td->getAttribute(qtPair.varID);

            // functionPerView[viewID].push_back(
            //     "\"Variable: "+std::to_string(qtPair.varID)+" "+
            //     "Threshold: \"+std::to_string(tuple."+att->_name+")+\" "+
            //     "Operator: = \";\n");

            // TODO:TODO:TODO:TODO:TODO:TODO: WHY DOES THIS SAY AGGREGATES[QUAD] !?!?!
            functionPerView[viewID].push_back(
                ".set("+std::to_string(qtPair.varID)+",tuple."+att->_name+",1,"+
                "&tuple.aggregates["+std::to_string(count)+"],"+
                "&V"+std::to_string(comp_viewID)+"[0].aggregates["+
                std::to_string(comp_count)+"]"+");\n");
        }
        else
        {   // Continuous variable
            
            // Find the view that corresponds to the query
            Query* query = qtPair.query;
            size_t& viewID = query->_aggregates[0]->_incoming[0].first;
            size_t& viewID2 = query->_aggregates[1]->_incoming[0].first;
            size_t& viewID3 = query->_aggregates[2]->_incoming[0].first;

            size_t& cviewID = query->_aggregates[3]->_incoming[0].first;
            size_t& cviewID2 = query->_aggregates[4]->_incoming[0].first;
            size_t& cviewID3 = query->_aggregates[5]->_incoming[0].first;

            if (viewID != viewID2 || viewID != viewID3 ||
                cviewID != viewID || cviewID2 != viewID || cviewID3 != viewID  )
                std::cout << "THERE IS AN ERROR IN genVarianceComputation" << std::endl;
        
            const size_t& count = query->_aggregates[0]->_incoming[0].second;
            const size_t& linear = query->_aggregates[1]->_incoming[0].second;
            const size_t& quad = query->_aggregates[2]->_incoming[0].second;

            const size_t& compcount = query->_aggregates[3]->_incoming[0].second;
            const size_t& complinear = query->_aggregates[4]->_incoming[0].second;
            const size_t& compquad = query->_aggregates[5]->_incoming[0].second;
        
            std::string viewTup = "V"+std::to_string(viewID)+"tuple";
            
            variancePerView[viewID].push_back(
                "(("+viewTup+".aggregates["+std::to_string(count)+"] > 0  && "+
                viewTup+".aggregates["+std::to_string(compcount)+"] > 0) ? "+
                viewTup+".aggregates["+std::to_string(quad)+"] - ("+
                viewTup+".aggregates["+std::to_string(linear)+"] * "+
                viewTup+".aggregates["+std::to_string(linear)+"]) / "+
                viewTup+".aggregates["+std::to_string(count)+"] + "+
                viewTup+".aggregates["+std::to_string(compquad)+"] - ("+
                viewTup+".aggregates["+std::to_string(complinear)+"] * "+
                viewTup+".aggregates["+std::to_string(complinear)+"]) / "+
                viewTup+".aggregates["+std::to_string(compcount)+"] : 1.79769e+308);\n"
                );
           
            // functionPerView[viewID].push_back(
            //     "\"Variable: "+std::to_string(qtPair.varID)+" "+
            //     "Threshold: "+std::to_string(qtPair.function->_parameter[0])+" "+
            //     "Operator: < \";\n");
            functionPerView[viewID].push_back(".set("+std::to_string(qtPair.varID)+","+
                std::to_string(qtPair.function->_parameter[0])+",0,"+
                "&V"+std::to_string(viewID)+"[0].aggregates["+std::to_string(count)+"],"+
                "&V"+std::to_string(cviewID)+"[0].aggregates["+
                std::to_string(compcount)+"]"+");\n");
        }
        
    }

    std::string numOfThresholds = "numberOfThresholds = ";
    size_t numOfContThresholds = 0;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;
        
        if (!_categoricalFeatures.test(var))
        {
            firstThreshold[var] = numOfContThresholds;
            numOfContThresholds += _thresholds[var].size();
        }
        else
        {
            size_t& viewID = _varToQueryMap[var]->_aggregates[0]->_incoming[0].first;   
            numOfThresholds += "V"+std::to_string(viewID)+".size() + ";
        }
    }
    numOfThresholds += std::to_string(numOfContThresholds)+";\n";

    std::string initVariance = offset(2)+numOfThresholds +
        offset(2)+"variance = new double[numberOfThresholds];\n";
    
    std::string contVariance = "", categVariance = "";
    std::string contFunctionIndex = "", categFunctionIndex = "";
    
    size_t varianceCount = 0;
    for (size_t viewID = 0; viewID < _compiler->numberOfViews(); ++viewID)
    {
        if (!variancePerView[viewID].empty())
        {
            std::string viewString = "V"+std::to_string(viewID);
            
            if (_compiler->getView(viewID)->_fVars.any())
            {
                // categVariance += offset(2)+"for ("+viewString+"_tuple& "+
                //     viewString+"tuple : "+viewString+")\n";
                // for (size_t j = 0; j < variancePerView[viewID].size(); ++j)
                // {
                //     categVariance += offset(3)+
                //         "variance[categIdx++] = "+variancePerView[viewID][j];
                    
                //     categFunctionIndex += 
                //         offset(2)+"for (V"+std::to_string(viewID)+"_tuple& tuple : "+
                //         "V"+std::to_string(viewID)+")\n"+offset(3)+
                //         "thresholdMap[categIdx++] = "+functionPerView[viewID][j];
                // }
                
                if (variancePerView[viewID].size() > 1)
                {
                    ERROR("THIS IS ODD, EXCEPCTED SIZE IS 1;\n");
                    exit(1);
                }

                Query* complement = complementQueryPerView[viewID];
                const size_t& comp_viewID =
                    complement->_aggregates[0]->_incoming[0].first;
                const size_t& comp_count =
                    complement->_aggregates[0]->_incoming[0].second;
                const size_t& comp_linear =
                    complement->_aggregates[1]->_incoming[0].second;
                const size_t& comp_quad =
                    complement->_aggregates[2]->_incoming[0].second;

                if (comp_count != comp_linear-1 || comp_count != comp_quad-2 ||
                    comp_linear != comp_quad-1)
                {    
                    ERROR("We should have expected the aggregates to be contiguous!\n");
                    exit(1);
                }

                // std::cout << "complement: " << comp_viewID << "  " << viewID << "\n";
                // std::cout << complement->_fVars << std::endl;
                // std::cout << _compiler->getView(viewID)->_fVars << std::endl;
                
                categVariance += offset(2)+"compaggs = &V"+std::to_string(comp_viewID)+
                    "[0].aggregates["+std::to_string(comp_count)+"];\n"+
                    offset(2)+"for ("+viewString+"_tuple& "+viewString+"tuple : "+
                    viewString+")\n"+offset(2)+"{\n"+
                    offset(3)+"if("+viewString+"tuple.aggregates[0] == 0 || "+
                    viewString+"tuple.aggregates[0] == compaggs[0])\n"+
                    offset(3)+"{\n"+
                    offset(4)+"variance[categIdx++] = 1.79769e+308;\n"+
                    offset(4)+"continue;\n"+
                    offset(3)+"}\n"+
                    offset(3)+"for (size_t i=0; i < 3; ++i)\n"+
                    offset(4)+"difference[i] = compaggs[i] - "+
                    viewString+"tuple.aggregates[i];\n"+
                    offset(3)+"variance[categIdx++] = "+variancePerView[viewID][0]+
                    offset(2)+"}\n";
                
                // categFunctionIndex +=offset(2)+"for (V"+std::to_string(viewID)+
                //     "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(3)+
                //     "thresholdMap[categIdx++] = "+functionPerView[viewID][0];
                categFunctionIndex +=offset(2)+"for (V"+std::to_string(viewID)+
                    "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(3)+
                    "thresholdMap[categIdx++]"+functionPerView[viewID][0];
                
                // for (size_t j = 0; j < variancePerView[viewID].size(); ++j)
                // {
                //     categVariance += "variance[categIdx++] = "+
                //         variancePerView[viewID][0];
                //     categFunctionIndex += 
                //         offset(2)+"for (V"+std::to_string(viewID)+"_tuple& tuple : "+
                //         "V"+std::to_string(viewID)+")\n"+offset(3)+
                //         "thresholdMap[categIdx++] = "+functionPerView[viewID][j];
                // }
            }
            else
            {
                contVariance += offset(2)+viewString+"_tuple& "+
                    viewString+"tuple = "+viewString+"[0];\n";
                                
                for (size_t j = 0; j < variancePerView[viewID].size(); ++j)
                {
                    contVariance += offset(2)+
                        "variance["+std::to_string(varianceCount)+"] = "+
                        variancePerView[viewID][j];

                    // contFunctionIndex += offset(2)+
                    //     "thresholdMap["+std::to_string(varianceCount)+"] = "+
                    //     functionPerView[viewID][j];
                    contFunctionIndex += offset(2)+
                        "thresholdMap["+std::to_string(varianceCount)+"]"+
                        functionPerView[viewID][j];
                    
                    ++varianceCount;
                }
            }
        }
    }

    std::string computeVariance = contVariance;
    
    if (!categVariance.empty())
    {    
        computeVariance += offset(2)+"size_t categIdx = "+
            std::to_string(numOfContThresholds)+";\n"+
            offset(2)+"double difference[3], *compaggs;\n"+
            categVariance;
    }
    
    computeVariance += "\n"+offset(2)+"double min_variance = variance[0];\n"+
        offset(2)+"size_t threshold = 0;\n\n"+
        offset(2)+"for (size_t t=1; t < numberOfThresholds; ++t)\n"+offset(2)+"{\n"+
        offset(3)+"if (variance[t] < min_variance)\n"+offset(3)+"{\n"+
        offset(4)+"min_variance = variance[t];\n"+offset(4)+"threshold = t;\n"+
        offset(3)+"}\n"+offset(2)+"}\n"+
        offset(2)+"std::cout << \"The minimum variance is: \" << min_variance <<"+
        "\" for variable \" << thresholdMap[threshold].varID << \" and threshold:"+
        " \" << thresholdMap[threshold].threshold << std::endl;\n"+
        offset(2)+"std::ofstream ofs(\"bestsplit.out\",std::ofstream::out);\n"+
        offset(2)+"ofs << std::fixed << min_variance << \"\\t\" << "+
        "thresholdMap[threshold].varID << \"\\t\" << "+
        "thresholdMap[threshold].threshold  << \"\\t\" << "+
        "thresholdMap[threshold].categorical  << \"\\t\" << "+
        "thresholdMap[threshold].aggregates[0]  << \"\\t\" << "+
        "thresholdMap[threshold].compAggregates[0] << \"\\t\" << "+
        "thresholdMap[threshold].aggregates[1]/thresholdMap[threshold].aggregates[0] << \"\\t\" << "+
        "thresholdMap[threshold].compAggregates[1]/thresholdMap[threshold].compAggregates[0] << std::endl;\n"+
        offset(2)+"ofs.close();\n";

    std::string functionIndex = contFunctionIndex;

    if (!categFunctionIndex.empty())
    {
        functionIndex += offset(2)+"size_t categIdx = "+
            std::to_string(numOfContThresholds)+";\n"+categFunctionIndex;
    }

    std::string thresholdStruct = offset(1)+"struct Threshold\n"+offset(1)+"{\n"+
        offset(2)+"size_t varID;\n"+offset(2)+"double threshold;\n"+
        offset(2)+"bool categorical;\n"+offset(2)+"double* aggregates;\n"+
        offset(2)+"double* compAggregates;\n"+offset(2)+
        "Threshold() : varID(0), threshold(0), categorical(false), "+
        "aggregates(nullptr), compAggregates(nullptr) {}\n"+
        offset(2)+"void set(size_t var, double t, bool c, double* agg, double *cagg)\n"+
        offset(2)+"{\n"+offset(3)+"varID = var;\n"+offset(3)+"threshold = t;\n"+
        offset(3)+"categorical = c;\n"+offset(3)+"aggregates = agg;\n"+
        offset(3)+"compAggregates = cagg;\n"+
        offset(2)+"}\n"+offset(1)+"};\n\n";
    
    return thresholdStruct+
        offset(1)+"size_t numberOfThresholds;\n"+
        offset(1)+"double* variance = nullptr;\n"+
        offset(1)+"Threshold* thresholdMap = nullptr;\n\n"+
        offset(1)+"void initCostArray()\n"+
        offset(1)+"{\n"+initVariance+
        // offset(2)+"thresholdMap = new std::string[numberOfThresholds];\n"+
        offset(2)+"thresholdMap = new Threshold[numberOfThresholds];\n"+
        functionIndex+offset(1)+"}\n\n"+
        offset(1)+"void computeCost()\n"+
        offset(1)+"{\n"+computeVariance+offset(1)+"}\n";    
}